

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_dot(runtime_type *this,var *a,token_base *b)

{
  types tVar1;
  bool bVar2;
  type_info *ptVar3;
  constant_values *pcVar4;
  var *pvVar5;
  shared_ptr<cs::name_space> *psVar6;
  type_t *this_00;
  proxy *ppVar7;
  structure *this_01;
  callable *pcVar8;
  namespace_t *pnVar9;
  runtime_error *prVar10;
  long in_RCX;
  initializer_list<cs_impl::any> __l;
  vector args;
  any local_70 [4];
  allocator_type local_50 [32];
  
  ptVar3 = cs_impl::any::type((any *)b);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&constant_values::typeinfo);
  if (bVar2) {
    pcVar4 = cs_impl::any::const_val<cs::constant_values>((any *)b);
    if (*pcVar4 == local_namepace) {
      pvVar5 = domain_manager::get_var_current<cs::var_id_const&>
                         ((domain_manager *)(a + 6),(var_id *)(in_RCX + 0x10));
    }
    else {
      if (*pcVar4 != global_namespace) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&args,"Unknown scope tag.",(allocator *)local_70);
        runtime_error::runtime_error(prVar10,(string *)&args);
        __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      pvVar5 = domain_manager::get_var_global<cs::var_id_const&>
                         ((domain_manager *)(a + 6),(var_id *)(in_RCX + 0x10));
    }
  }
  else {
    ptVar3 = cs_impl::any::type((any *)b);
    bVar2 = std::type_info::operator==
                      (ptVar3,(type_info *)&std::shared_ptr<cs::name_space>::typeinfo);
    if (bVar2) {
      psVar6 = cs_impl::any::val<std::shared_ptr<cs::name_space>>((any *)b);
      pvVar5 = name_space::get_var((psVar6->
                                   super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr,(var_id *)(in_RCX + 0x10));
    }
    else {
      ptVar3 = cs_impl::any::type((any *)b);
      bVar2 = std::type_info::operator==(ptVar3,(type_info *)&type_t::typeinfo);
      if (!bVar2) {
        ptVar3 = cs_impl::any::type((any *)b);
        bVar2 = std::type_info::operator==(ptVar3,(type_info *)&structure::typeinfo);
        if (bVar2) {
          this_01 = cs_impl::any::val<cs::structure>((any *)b);
          pvVar5 = structure::get_var<cs::var_id_const&>(this_01,(var_id *)(in_RCX + 0x10));
          ptVar3 = cs_impl::any::type(pvVar5);
          bVar2 = std::type_info::operator==(ptVar3,(type_info *)&callable::typeinfo);
          if ((bVar2) &&
             (pcVar8 = cs_impl::any::const_val<cs::callable>(pvVar5), pcVar8->mType == member_fn)) {
            cs_impl::any::make_protect<cs::object_method,cs_impl::any_const&,cs_impl::any&>
                      ((any *)this,(any *)b,pvVar5);
            return (var)(proxy *)this;
          }
          ppVar7 = pvVar5->mDat;
        }
        else {
          pnVar9 = cs_impl::any::get_ext((any *)b);
          pvVar5 = name_space::get_var((pnVar9->
                                       super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr,(var_id *)(in_RCX + 0x10));
          ptVar3 = cs_impl::any::type(pvVar5);
          bVar2 = std::type_info::operator==(ptVar3,(type_info *)&callable::typeinfo);
          if (bVar2) {
            pcVar8 = cs_impl::any::const_val<cs::callable>(pvVar5);
            tVar1 = pcVar8->mType;
            if (tVar1 == member_visitor) {
              local_70[0].mDat = (proxy *)b->_vptr_token_base;
              if (local_70[0].mDat != (proxy *)0x0) {
                (local_70[0].mDat)->refcount = (local_70[0].mDat)->refcount + 1;
              }
              __l._M_len = 1;
              __l._M_array = local_70;
              std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&args,__l,local_50);
              cs_impl::any::recycle(local_70);
              std::
              function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
              operator()((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                          *)this,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar8);
              std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&args);
              return (var)(proxy *)this;
            }
            if (tVar1 != force_regular) {
              args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
              super__Vector_impl_data._M_start._0_1_ = tVar1 == request_fold;
              cs_impl::any::make_protect<cs::object_method,cs_impl::any_const&,cs_impl::any&,bool>
                        ((any *)this,(any *)b,pvVar5,(bool *)&args);
              return (var)(proxy *)this;
            }
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&args,"Cannot call regular function as member function.",
                       (allocator *)local_70);
            runtime_error::runtime_error(prVar10,(string *)&args);
            __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
          }
          ppVar7 = pvVar5->mDat;
        }
        goto LAB_002a4eb3;
      }
      this_00 = cs_impl::any::const_val<cs::type_t>((any *)b);
      pvVar5 = type_t::get_var<cs::var_id_const&>(this_00,(var_id *)(in_RCX + 0x10));
    }
  }
  ppVar7 = pvVar5->mDat;
LAB_002a4eb3:
  if (ppVar7 != (proxy *)0x0) {
    ppVar7->refcount = ppVar7->refcount + 1;
  }
  (this->literals).
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .ctrl_ = &ppVar7->is_rvalue;
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_dot(const var &a, token_base *b)
	{
		if (a.type() == typeid(constant_values)) {
			switch (a.const_val<constant_values>()) {
			case constant_values::global_namespace:
				return storage.get_var_global(static_cast<token_id *>(b)->get_id());
			case constant_values::local_namepace:
				return storage.get_var_current(static_cast<token_id *>(b)->get_id());
			default:
				throw runtime_error("Unknown scope tag.");
			}
		}
		else if (a.type() == typeid(namespace_t))
			return a.val<namespace_t>()->get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(type_t))
			return a.const_val<type_t>().get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(structure)) {
			var &val = a.val<structure>().get_var(static_cast<token_id *>(b)->get_id());
			if (val.type() == typeid(callable) && val.const_val<callable>().is_member_fn())
				return var::make_protect<object_method>(a, val);
			else
				return val;
		}
		else {
			try {
				var &val = a.get_ext()->get_var(static_cast<token_id *>(b)->get_id());
				if (val.type() == typeid(callable)) {
					const callable &func = val.const_val<callable>();
					switch (func.type()) {
					case callable::types::member_visitor: {
						vector args{a};
						return func.call(args);
					}
					case callable::types::force_regular:
						throw runtime_error("Cannot call regular function as member function.");
					default:
						return var::make_protect<object_method>(a, val, func.is_request_fold());
					}
				}
				else
					return val;
			}
			catch (...) {
				if (a.type() == typeid(hash_map)) {
					const auto &cmap = a.const_val<hash_map>();
					const string &str = static_cast<token_id *>(b)->get_id().get_id();
					if (cmap.count(str) == 0)
						throw runtime_error(std::string("Key \"") + str + "\" does not exist.");
					return cmap.at(str);
				}
				else
					throw;
			}
		}
	}